

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

int GA_Assemble_duplicate(int g_a,char *array_name,void *ptr)

{
  char **ppcVar1;
  int iVar2;
  long *plVar3;
  C_Integer *pCVar4;
  Integer IVar5;
  long in_RDX;
  char *in_RSI;
  int in_EDI;
  char err_string_1 [256];
  char err_string [256];
  int maplen;
  int g_b;
  char **ptr_arr;
  getmem_t *info;
  int extra;
  int ga_handle;
  int i;
  char **save_ptr;
  long local_258;
  bool local_249;
  char local_248 [256];
  char local_148 [144];
  Integer in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  int local_28;
  int local_24;
  
  plVar3 = (long *)(in_RDX - ((int)(GAnproc << 3) + 0x20));
  iVar2 = calc_maplen(in_EDI + 1000);
  pnga_sync();
  GAstat.numcre = GAstat.numcre + 1;
  if ((in_EDI + 1000 < 0) || (_max_global_array <= in_EDI + 1000)) {
    sprintf(local_148,"%s: INVALID ARRAY HANDLE","ga_assemble_duplicate");
    pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  if (GA[in_EDI + 1000].actv == 0) {
    sprintf(local_248,"%s: ARRAY NOT ACTIVE","ga_assemble_duplicate");
    pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  local_28 = -1;
  local_24 = 0;
  do {
    if (GA[local_24].actv_handle == 0) {
      local_28 = local_24;
    }
    local_24 = local_24 + 1;
    local_249 = local_24 < _max_global_array && local_28 == -1;
  } while (local_249);
  if (local_28 == -1) {
    pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  gai_init_struct(0);
  GA[local_28].actv_handle = 1;
  ppcVar1 = GA[local_28].ptr;
  memcpy(GA + local_28,GA + (in_EDI + 1000),0x368);
  strcpy(GA[local_28].name,in_RSI);
  GA[local_28].ptr = ppcVar1;
  if (0 < iVar2) {
    pCVar4 = (C_Integer *)malloc((long)(iVar2 + 1) << 3);
    GA[local_28].mapc = pCVar4;
    for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
      GA[local_28].mapc[local_24] = GA[in_EDI + 1000].mapc[local_24];
    }
    GA[local_28].mapc[iVar2] = -1;
  }
  IVar5 = pnga_type_f2c(plVar3[1]);
  if (((IVar5 < 1000) || (IVar5 = pnga_type_f2c(plVar3[1]), 0x4e7 < IVar5)) ||
     (IVar5 = pnga_type_f2c(plVar3[1]), ga_types[IVar5 + -1000].active == 0)) {
    pnga_type_f2c(plVar3[1]);
    pnga_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  IVar5 = pnga_type_f2c(plVar3[1]);
  GA[local_28].type = (int)IVar5;
  GA[local_28].size = plVar3[2];
  GA[local_28].id = *plVar3;
  memcpy(GA[local_28].ptr,plVar3 + 4,GAnproc << 3);
  GAstat.curmem = GA[local_28].size + GAstat.curmem;
  local_258 = GAstat.curmem;
  if (GAstat.curmem <= GAstat.maxmem) {
    local_258 = GAstat.maxmem;
  }
  GAstat.maxmem = local_258;
  pnga_sync();
  return local_28 + -1000;
}

Assistant:

int GA_Assemble_duplicate(int g_a, char* array_name, void* ptr)
{
char     **save_ptr;
int      i, ga_handle;
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*);
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);
int g_b;
int maplen = calc_maplen(GA_OFFSET + g_a);


      pnga_sync();

      GAstat.numcre ++;

      ga_check_handleM(g_a,"ga_assemble_duplicate");

      /* find a free global_array handle for g_b */
      ga_handle =-1; i=0;
      do{
        if(!GA[i].actv_handle) ga_handle=i;
        i++;
      }while(i<_max_global_array && ga_handle==-1);
      if( ga_handle == -1)
          pnga_error("ga_assemble_duplicate: too many arrays ", 
                                           (Integer)_max_global_array);
      g_b = ga_handle - GA_OFFSET;

      gai_init_struct(ga_handle);
      GA[ga_handle].actv_handle = 1;

      /*** copy content of the data structure ***/
      save_ptr = GA[ga_handle].ptr;
      GA[ga_handle] = GA[GA_OFFSET + g_a];
      strcpy(GA[ga_handle].name, array_name);
      GA[ga_handle].ptr = save_ptr;
      if (maplen > 0) {
        GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
        for(i=0;i<maplen; i++)GA[ga_handle].mapc[i] = GA[GA_OFFSET+ g_a].mapc[i];
        GA[ga_handle].mapc[maplen] = -1;
      }

      /* get ptrs and datatype from user memory */
      gam_checktype(pnga_type_f2c(info->type));
      GA[ga_handle].type = pnga_type_f2c(info->type);
      GA[ga_handle].size = (C_Long)info->size;
      GA[ga_handle].id = info->id;
      memcpy(GA[ga_handle].ptr,ptr_arr,(size_t)GAnproc*sizeof(char**));

      GAstat.curmem += (long)GA[ga_handle].size;
      GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);

      pnga_sync();

      return(g_b);
}